

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# np_nes_apu.c
# Opt level: O1

void NES_APU_np_Reset(void *chip)

{
  long lVar1;
  NES_APU *apu;
  ulong uVar2;
  int iVar3;
  
  *(undefined4 *)((long)chip + 0x30) = 0;
  *(undefined8 *)((long)chip + 0x120) = 0;
  *(undefined8 *)((long)chip + 0xe8) = 0;
  *(undefined8 *)((long)chip + 0xf0) = 0;
  *(undefined8 *)((long)chip + 0xf8) = 0;
  *(undefined8 *)((long)chip + 0x100) = 0;
  *(undefined8 *)((long)chip + 0x108) = 0;
  *(undefined8 *)((long)chip + 0x110) = 0;
  *(undefined8 *)((long)chip + 0x116) = 0;
  lVar1 = 0x138;
  do {
    *(undefined4 *)((long)chip + lVar1 * 4 + -0x3b8) = 1;
    *(undefined4 *)((long)chip + lVar1 * 4 + -0x3b0) = 0;
    *(undefined1 *)((long)chip + lVar1) = 0;
    *(undefined1 *)((long)chip + lVar1 + 2) = 0;
    *(undefined1 *)((long)chip + lVar1 + 4) = 0;
    *(undefined4 *)((long)chip + lVar1 * 4 + -0x3a0) = 0;
    *(undefined4 *)((long)chip + lVar1 * 4 + -0x398) = 0;
    *(undefined4 *)((long)chip + lVar1 * 4 + -0x390) = 0;
    *(undefined4 *)((long)chip + lVar1 * 4 + -0x388) = 0;
    *(undefined1 *)((long)chip + lVar1 + 0x28) = 0;
    lVar1 = lVar1 + 1;
  } while (lVar1 == 0x139);
  iVar3 = -8;
  do {
    NES_APU_np_Write(chip,(short)iVar3 + 0x4008,'\0');
    iVar3 = iVar3 + 1;
  } while (iVar3 != 0);
  *(undefined1 *)((long)chip + 0x49) = 0;
  *(undefined8 *)((long)chip + 0x158) = 0;
  *(undefined2 *)((long)chip + 0x160) = 0;
  if (*(int *)((long)chip + 8) != 0) {
    *(undefined2 *)((long)chip + 0x160) = 0x101;
    *(undefined1 *)((long)chip + 0x49) = 0xf;
  }
  if (*(int *)((long)chip + 0x18) != 0) {
    *(undefined2 *)((long)chip + 0x118) = 0;
    *(undefined8 *)((long)chip + 0x120) = 0;
    *(undefined1 *)((long)chip + 0x11a) = 1;
    *(undefined8 *)((long)chip + 0x130) = 0;
    *(undefined8 *)((long)chip + 0x110) = 0xffffffff;
    *(undefined1 *)((long)chip + 0x35) = 8;
    *(undefined2 *)((long)chip + 0x11b) = 0x101;
    *(undefined1 *)((long)chip + 0x11d) = 1;
    *(undefined1 *)((long)chip + 0x39) = 8;
  }
  *(undefined8 *)((long)chip + 0x54) = 0;
  uVar2 = 0xac44;
  if (*(uint *)((long)chip + 0x5c) != 0) {
    uVar2 = (ulong)*(uint *)((long)chip + 0x5c);
  }
  *(int *)((long)chip + 0x5c) = (int)uVar2;
  *(ulong *)((long)chip + 0x168) =
       (uVar2 >> 1 | (ulong)*(uint *)((long)chip + 0x60) << 0x20) / uVar2;
  *(undefined8 *)((long)chip + 0x170) = 0;
  return;
}

Assistant:

void NES_APU_np_Reset(void* chip)
{
	NES_APU* apu = (NES_APU*)chip;
	int i;
	apu->gclock = 0;
	//apu->mask = 0;

	for (i=0; i<2; ++i)
	{
		apu->scounter[i] = 0;
		apu->sphase[i] = 0;
		apu->duty[i] = 0;
		apu->volume[i] = 0;
		apu->freq[i] = 0;
		apu->sfreq[i] = 0;
		apu->sweep_enable[i] = 0;
		apu->sweep_mode[i] = 0;
		apu->sweep_write[i] = 0;
		apu->sweep_div_period[i] = 0;
		apu->sweep_div[i] = 1;
		apu->sweep_amount[i] = 0;
		apu->envelope_disable[i] = 0;
		apu->envelope_loop[i] = 0;
		apu->envelope_write[i] = 0;
		apu->envelope_div_period[i] = 0;
		apu->envelope_div[i] = 0;
		apu->envelope_counter[i] = 0;
		apu->length_counter[i] = 0;
		apu->enable[i] = 0;
	}

	for (i = 0x4000; i < 0x4008; i++)
		NES_APU_np_Write(apu, i, 0);

	NES_APU_np_Write(apu, 0x4015, 0);
	if (apu->option[OPT_UNMUTE_ON_RESET])
		NES_APU_np_Write(apu, 0x4015, 0x0f);
	if (apu->option[OPT_NEGATE_SWEEP_INIT])
	{
		NES_APU_np_Write(apu, 0x4001, 0x08);
		NES_APU_np_Write(apu, 0x4005, 0x08);
	}

	for (i = 0; i < 2; i++)
		apu->out[i] = 0;

	NES_APU_np_SetRate(apu, apu->rate);
	RC_RESET(&apu->tick_count);
}